

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_SpawnPlayerMissile
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClassActor *type;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  VMValue *pVVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  VMValue *pVVar8;
  AActor *pAVar9;
  PClassActor *pPVar10;
  VMValue *pVVar11;
  char *pcVar12;
  bool bVar13;
  AActor *missileactor;
  DAngle local_38;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar9 = (AActor *)(param->field_0).field_1.a;
      if (pAVar9 != (AActor *)0x0) {
        if ((pAVar9->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(pAVar9->super_DThinker).super_DObject._vptr_DObject)(pAVar9);
          (pAVar9->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (pAVar9->super_DThinker).super_DObject.Class;
        bVar13 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar13) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar13 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar13) {
          pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00431e85;
        }
      }
      if (numparam == 1) {
        pcVar12 = "(paramnum) < numparam";
      }
      else {
        if ((param[1].field_0.field_3.Type == '\x03') &&
           ((param[1].field_0.field_1.atag == 1 || (param[1].field_0.field_1.a == (void *)0x0)))) {
          type = (PClassActor *)param[1].field_0.field_1.a;
          if ((type != (PClassActor *)0x0) &&
             (pPVar10 = type, type != (PClassActor *)AActor::RegistrationInfo.MyClass)) {
            do {
              pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
              if (pPVar10 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
            } while (pPVar10 != (PClassActor *)0x0);
            if (pPVar10 == (PClassActor *)0x0) {
              pcVar12 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
              goto LAB_00431f7d;
            }
          }
          if (numparam < 3) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[2].field_0.field_3.Type != '\x01') {
              pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_00431ea4;
            }
          }
          else {
            pVVar4 = param;
            if (param[2].field_0.field_3.Type != '\x01') {
              pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_00431ea4:
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1ad2,
                            "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          local_38.Degrees = (double)pVVar4[2].field_0.field_1.a;
          if (numparam < 4) {
            pVVar4 = defaultparam->Array;
            if (pVVar4[3].field_0.field_3.Type != '\x01') {
              pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_00431ec3;
            }
          }
          else {
            pVVar4 = param;
            if (param[3].field_0.field_3.Type != '\x01') {
              pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_00431ec3:
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1ad3,
                            "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 5) {
            pVVar5 = defaultparam->Array;
            if (pVVar5[4].field_0.field_3.Type != '\x01') {
              pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_00431ee2;
            }
          }
          else {
            pVVar5 = param;
            if (param[4].field_0.field_3.Type != '\x01') {
              pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_00431ee2:
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1ad4,
                            "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 6) {
            pVVar6 = defaultparam->Array;
            if (pVVar6[5].field_0.field_3.Type != '\x01') {
              pcVar12 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_00431f01;
            }
          }
          else {
            pVVar6 = param;
            if (param[5].field_0.field_3.Type != '\x01') {
              pcVar12 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_00431f01:
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1ad5,
                            "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 7) {
            pVVar7 = defaultparam->Array;
            if ((pVVar7[6].field_0.field_3.Type != '\x03') || (pVVar7[6].field_0.field_1.atag != 0))
            {
              pcVar12 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && (defaultparam[paramnum]).atag == ATAG_GENERIC"
              ;
              goto LAB_00431e66;
            }
          }
          else if ((param[6].field_0.field_3.Type != '\x03') ||
                  (pVVar7 = param, param[6].field_0.field_1.atag != 0)) {
            pcVar12 = 
            "(param[paramnum]).Type == REGT_POINTER && (param[paramnum]).atag == ATAG_GENERIC";
LAB_00431e66:
            __assert_fail(pcVar12,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                          ,0x1ad6,
                          "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          if (numparam < 8) {
            pVVar8 = defaultparam->Array;
            if (pVVar8[7].field_0.field_3.Type != '\0') {
              pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_00431f20;
            }
          }
          else {
            pVVar8 = param;
            if (param[7].field_0.field_3.Type != '\0') {
              pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_00431f20:
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1ad7,
                            "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 9) {
            pVVar11 = defaultparam->Array;
            if (pVVar11[8].field_0.field_3.Type != '\0') {
              pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_00431f3f;
            }
          }
          else {
            pVVar11 = param;
            if (param[8].field_0.field_3.Type != '\0') {
              pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_00431f3f:
              __assert_fail(pcVar12,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x1ad8,
                            "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (numparam < 10) {
            param = defaultparam->Array;
            if (param[9].field_0.field_3.Type == '\0') goto LAB_00431da9;
            pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[9].field_0.field_3.Type == '\0') {
LAB_00431da9:
              if (numparam == 2) {
                local_38.Degrees = (pAVar9->Angles).Yaw.Degrees;
              }
              pAVar9 = P_SpawnPlayerMissile
                                 (pAVar9,pVVar4[3].field_0.f,pVVar5[4].field_0.f,pVVar6[5].field_0.f
                                  ,type,&local_38,
                                  (FTranslatedLineTarget *)pVVar7[6].field_0.field_1.a,&missileactor
                                  ,pVVar8[7].field_0.i != 0,pVVar11[8].field_0.i != 0,
                                  param[9].field_0.i);
              if (0 < numret) {
                VMReturn::SetPointer(ret,pAVar9,1);
              }
              if (1 < numret) {
                VMReturn::SetPointer(ret + 1,missileactor,1);
                numret = 2;
              }
              return numret;
            }
            pcVar12 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x1ad9,
                        "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar12 = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
      }
LAB_00431f7d:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x1ad1,
                    "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00431e85:
  __assert_fail(pcVar12,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x1ad0,
                "int AF_AActor_SpawnPlayerMissile(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnPlayerMissile)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(type, AActor);
	PARAM_ANGLE_DEF(angle);
	PARAM_FLOAT_DEF(x);
	PARAM_FLOAT_DEF(y);
	PARAM_FLOAT_DEF(z);
	PARAM_POINTER_DEF(lt, FTranslatedLineTarget);
	PARAM_BOOL_DEF(nofreeaim);
	PARAM_BOOL_DEF(noautoaim);
	PARAM_INT_DEF(aimflags);
	AActor *missileactor;
	if (numparam == 2) angle = self->Angles.Yaw;
	AActor *misl = P_SpawnPlayerMissile(self, x, y, z, type, angle, lt, &missileactor, nofreeaim, noautoaim, aimflags);
	if (numret > 0) ret[0].SetPointer(misl, ATAG_OBJECT);
	if (numret > 1) ret[1].SetPointer(missileactor, ATAG_OBJECT), numret = 2;
	return numret;
}